

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderBuiltinVarTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::sr::anon_unknown_1::BuiltinGlFragCoordXYZCaseInstance::iterate
          (TestStatus *__return_storage_ptr__,BuiltinGlFragCoordXYZCaseInstance *this)

{
  TestStatus *pTVar1;
  uint z;
  uint uVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  float fVar5;
  float fVar6;
  allocator<char> local_119;
  uint local_118;
  uint local_114;
  float local_110;
  float local_10c;
  TestStatus *local_108;
  Vec3 scaledFC;
  Vec3 fragCoord;
  Vec4 resultColor;
  ConstPixelBufferAccess local_c8;
  float local_98;
  float fStack_94;
  undefined8 uStack_90;
  Vector<float,_3> local_88;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  UVec2 viewportSize;
  deUint16 indices [6];
  
  local_108 = __return_storage_ptr__;
  ShaderRenderCaseInstance::getViewportSize(&this->super_ShaderRenderCaseInstance);
  uVar3 = viewportSize.m_data[0];
  local_98 = (float)(int)uVar3;
  uVar2 = viewportSize.m_data[1];
  fStack_94 = (float)(int)uVar2;
  uStack_90 = 0;
  auVar4._4_4_ = fStack_94;
  auVar4._0_4_ = local_98;
  auVar4._8_8_ = 0;
  auVar4 = divps(_DAT_00963870,auVar4);
  local_88.m_data._0_8_ = auVar4._0_8_;
  local_88.m_data[2] = 1.0;
  indices[0] = 2;
  indices[1] = 1;
  indices[2] = 3;
  indices[3] = 0;
  indices[4] = 1;
  indices[5] = 2;
  (*(this->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance[4])(this);
  z = 0;
  ShaderRenderCaseInstance::addUniform<tcu::Vector<float,3>>
            (&this->super_ShaderRenderCaseInstance,0,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&local_88);
  local_c8.m_format.order = 0x3e000000;
  local_c8.m_format.type = 0x3e800000;
  local_c8.m_size.m_data[0] = 0x3f000000;
  local_c8.m_size.m_data[1] = 0x3f800000;
  ShaderRenderCaseInstance::render
            (&this->super_ShaderRenderCaseInstance,4,2,indices,(Vec4 *)&local_c8);
  if ((int)uVar3 < 1) {
    uVar3 = 0;
  }
  local_118 = 0;
  if (0 < (int)uVar2) {
    local_118 = uVar2;
  }
  local_78 = fStack_94;
  fStack_74 = fStack_94;
  fStack_70 = fStack_94;
  fStack_6c = fStack_94;
  local_114 = uVar2;
  do {
    if (z == local_118) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,"Result image matches reference",
                 (allocator<char> *)&resultColor);
      pTVar1 = local_108;
      tcu::TestStatus::pass(local_108,(string *)&local_c8);
LAB_0059464e:
      std::__cxx11::string::~string((string *)&local_c8);
      return pTVar1;
    }
    local_10c = ((float)(int)(~z + local_114) + 0.5) / local_78;
    local_110 = (float)(int)z + 0.5;
    for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      fragCoord.m_data[0] = (float)(int)uVar2 + 0.5;
      fragCoord.m_data[2] = (fragCoord.m_data[0] / local_98 + local_10c) * 0.5;
      fragCoord.m_data[1] = local_110;
      tcu::operator*((tcu *)&scaledFC,&fragCoord,&local_88);
      fVar5 = scaledFC.m_data[0];
      local_58 = ZEXT416((uint)scaledFC.m_data[1]);
      local_68 = ZEXT416((uint)scaledFC.m_data[2]);
      tcu::TextureLevel::getAccess(&local_c8,&(this->super_ShaderRenderCaseInstance).m_resultImage);
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)&resultColor,(int)&local_c8,uVar2,z);
      fVar5 = fVar5 - resultColor.m_data[0];
      fVar6 = -fVar5;
      if (-fVar5 <= fVar5) {
        fVar6 = fVar5;
      }
      if (1e-05 < fVar6) {
LAB_00594626:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c8,"Image mismatch",&local_119);
        pTVar1 = local_108;
        tcu::TestStatus::fail(local_108,(string *)&local_c8);
        goto LAB_0059464e;
      }
      fVar6 = (float)local_58._0_4_ - resultColor.m_data[1];
      fVar5 = -fVar6;
      if (-fVar6 <= fVar6) {
        fVar5 = fVar6;
      }
      if (1e-05 < fVar5) goto LAB_00594626;
      fVar6 = (float)local_68._0_4_ - resultColor.m_data[2];
      fVar5 = -fVar6;
      if (-fVar6 <= fVar6) {
        fVar5 = fVar6;
      }
      if (1e-05 < fVar5) goto LAB_00594626;
    }
    z = z + 1;
  } while( true );
}

Assistant:

TestStatus BuiltinGlFragCoordXYZCaseInstance::iterate (void)
{
	const UVec2		viewportSize	= getViewportSize();
	const int		width			= viewportSize.x();
	const int		height			= viewportSize.y();
	const tcu::Vec3	scale			(1.f / float(width), 1.f / float(height), 1.0f);
	const float		precision		= 0.00001f;
	const deUint16	indices[6]		=
	{
		2, 1, 3,
		0, 1, 2,
	};

	setup();
	addUniform(0, VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, scale);

	render(4, 2, indices);

	// Reference image
	for (int y = 0; y < height; y++)
	{
		for (int x = 0; x < width; x++)
		{
			const float	xf			= (float(x) + .5f) / float(width);
			const float	yf			= (float(height - y - 1) + .5f) / float(height);
			const float	z			= (xf + yf) / 2.0f;
			const Vec3	fragCoord	(float(x) + .5f, float(y) + .5f, z);
			const Vec3	scaledFC	= fragCoord*scale;
			const Vec4	color		(scaledFC.x(), scaledFC.y(), scaledFC.z(), 1.0f);
			const Vec4	resultColor	= getResultImage().getAccess().getPixel(x, y);

			if (de::abs(color.x() - resultColor.x()) > precision ||
				de::abs(color.y() - resultColor.y()) > precision ||
				de::abs(color.z() - resultColor.z()) > precision)
			return TestStatus::fail("Image mismatch");
		}
	}

	return TestStatus::pass("Result image matches reference");
}